

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_test.c
# Opt level: O1

void test_msg_header_uint64(void)

{
  undefined8 uVar1;
  nng_err nVar2;
  int iVar3;
  nng_err nVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint64_t local_40;
  uint64_t v;
  nng_msg *msg;
  
  nVar2 = nng_msg_alloc((nng_msg **)&v,0);
  pcVar5 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                         ,0x1c9,"%s: expected success, got %s (%d)","nng_msg_alloc(&msg, 0)",pcVar5,
                         nVar2);
  if (iVar3 != 0) {
    nVar2 = nng_msg_header_append_u64((nng_msg *)v,2);
    pcVar5 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                           ,0x1cb,"%s: expected success, got %s (%d)",
                           "nng_msg_header_append_u64(msg, 2)",pcVar5,nVar2);
    if (iVar3 != 0) {
      nVar2 = nng_msg_header_insert_u64((nng_msg *)v,1);
      pcVar5 = nng_strerror(nVar2);
      iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                             ,0x1cc,"%s: expected success, got %s (%d)",
                             "nng_msg_header_insert_u64(msg, 1)",pcVar5,nVar2);
      if (iVar3 != 0) {
        nVar2 = nng_msg_header_append_u64((nng_msg *)v,3);
        pcVar5 = nng_strerror(nVar2);
        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                               ,0x1cd,"%s: expected success, got %s (%d)",
                               "nng_msg_header_append_u64(msg, 3)",pcVar5,nVar2);
        if (iVar3 != 0) {
          nVar2 = nng_msg_header_insert_u64((nng_msg *)v,0);
          pcVar5 = nng_strerror(nVar2);
          iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                 ,0x1ce,"%s: expected success, got %s (%d)",
                                 "nng_msg_header_insert_u64(msg, 0)",pcVar5,nVar2);
          if (iVar3 != 0) {
            nVar2 = nng_msg_header_trim_u64((nng_msg *)v,&local_40);
            pcVar5 = nng_strerror(nVar2);
            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                   ,0x1cf,"%s: expected success, got %s (%d)",
                                   "nng_msg_header_trim_u64(msg, &v)",pcVar5,nVar2);
            if (iVar3 != 0) {
              iVar3 = acutest_check_((uint)(local_40 == 0),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                     ,0x1d0,"%s","v == 0");
              if (iVar3 != 0) {
                sVar6 = nng_msg_header_len((nng_msg *)v);
                iVar3 = acutest_check_((uint)(sVar6 == 0x18),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                       ,0x1d1,"%s","nng_msg_header_len(msg) == sizeof(data)");
                if (iVar3 != 0) {
                  pcVar5 = (char *)nng_msg_header((nng_msg *)v);
                  uVar1 = *(undefined8 *)(pcVar5 + 0x10);
                  auVar8[0] = -((char)uVar1 == '\0');
                  auVar8[1] = -((char)((ulong)uVar1 >> 8) == '\0');
                  auVar8[2] = -((char)((ulong)uVar1 >> 0x10) == '\0');
                  auVar8[3] = -((char)((ulong)uVar1 >> 0x18) == '\0');
                  auVar8[4] = -((char)((ulong)uVar1 >> 0x20) == '\0');
                  auVar8[5] = -((char)((ulong)uVar1 >> 0x28) == '\0');
                  auVar8[6] = -((char)((ulong)uVar1 >> 0x30) == '\0');
                  auVar8[7] = -((char)((ulong)uVar1 >> 0x38) == '\x03');
                  auVar8[8] = 0xff;
                  auVar8[9] = 0xff;
                  auVar8[10] = 0xff;
                  auVar8[0xb] = 0xff;
                  auVar8[0xc] = 0xff;
                  auVar8[0xd] = 0xff;
                  auVar8[0xe] = 0xff;
                  auVar8[0xf] = 0xff;
                  auVar9[0] = -(*pcVar5 == '\0');
                  auVar9[1] = -(pcVar5[1] == '\0');
                  auVar9[2] = -(pcVar5[2] == '\0');
                  auVar9[3] = -(pcVar5[3] == '\0');
                  auVar9[4] = -(pcVar5[4] == '\0');
                  auVar9[5] = -(pcVar5[5] == '\0');
                  auVar9[6] = -(pcVar5[6] == '\0');
                  auVar9[7] = -(pcVar5[7] == '\x01');
                  auVar9[8] = -(pcVar5[8] == '\0');
                  auVar9[9] = -(pcVar5[9] == '\0');
                  auVar9[10] = -(pcVar5[10] == '\0');
                  auVar9[0xb] = -(pcVar5[0xb] == '\0');
                  auVar9[0xc] = -(pcVar5[0xc] == '\0');
                  auVar9[0xd] = -(pcVar5[0xd] == '\0');
                  auVar9[0xe] = -(pcVar5[0xe] == '\0');
                  auVar9[0xf] = -(pcVar5[0xf] == '\x02');
                  auVar9 = auVar9 & auVar8;
                  iVar3 = acutest_check_((uint)((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                                         (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                                                         | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) <<
                                                           2 | (ushort)(SUB161(auVar9 >> 0x1f,0) & 1
                                                                       ) << 3 |
                                                         (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4
                                                         | (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) <<
                                                           5 | (ushort)(SUB161(auVar9 >> 0x37,0) & 1
                                                                       ) << 6 |
                                                         (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7
                                                         | (ushort)(SUB161(auVar9 >> 0x47,0) & 1) <<
                                                           8 | (ushort)(SUB161(auVar9 >> 0x4f,0) & 1
                                                                       ) << 9 |
                                                         (ushort)(SUB161(auVar9 >> 0x57,0) & 1) <<
                                                         10 | (ushort)(SUB161(auVar9 >> 0x5f,0) & 1)
                                                              << 0xb |
                                                         (ushort)(SUB161(auVar9 >> 0x67,0) & 1) <<
                                                         0xc | (ushort)(SUB161(auVar9 >> 0x6f,0) & 1
                                                                       ) << 0xd |
                                                         (ushort)(SUB161(auVar9 >> 0x77,0) & 1) <<
                                                         0xe | (ushort)(byte)(auVar9[0xf] >> 7) <<
                                                               0xf) == 0xffff),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                         ,0x1d2,"%s",
                                         "memcmp(nng_msg_header(msg), data, sizeof(data)) == 0");
                  if (iVar3 != 0) {
                    nVar2 = nng_msg_header_trim_u64((nng_msg *)v,&local_40);
                    pcVar5 = nng_strerror(nVar2);
                    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                           ,0x1d3,"%s: expected success, got %s (%d)",
                                           "nng_msg_header_trim_u64(msg, &v)",pcVar5,nVar2);
                    if (iVar3 != 0) {
                      iVar3 = acutest_check_((uint)(local_40 == 1),
                                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                             ,0x1d4,"%s","v == 1");
                      if (iVar3 != 0) {
                        nVar2 = nng_msg_header_chop_u64((nng_msg *)v,&local_40);
                        pcVar5 = nng_strerror(nVar2);
                        iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                               ,0x1d5,"%s: expected success, got %s (%d)",
                                               "nng_msg_header_chop_u64(msg, &v)",pcVar5,nVar2);
                        if (iVar3 != 0) {
                          iVar3 = acutest_check_((uint)(local_40 == 3),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                 ,0x1d6,"%s","v == 3");
                          if (iVar3 != 0) {
                            nVar2 = nng_msg_header_trim_u64((nng_msg *)v,&local_40);
                            pcVar5 = nng_strerror(nVar2);
                            iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                  ,0x1d7,"%s: expected success, got %s (%d)",
                                                  "nng_msg_header_trim_u64(msg, &v)",pcVar5,nVar2);
                            if (iVar3 != 0) {
                              iVar3 = acutest_check_((uint)(local_40 == 2),
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                  ,0x1d8,"%s","v == 2");
                              if (iVar3 != 0) {
                                nVar4 = nng_msg_header_trim_u64((nng_msg *)v,&local_40);
                                pcVar5 = nng_strerror(NNG_EINVAL);
                                acutest_check_((uint)(nVar4 == NNG_EINVAL),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                               ,0x1d9,"%s fails with %s",
                                               "nng_msg_header_trim_u64(msg, &v)",pcVar5,nVar2);
                                pcVar5 = nng_strerror(NNG_EINVAL);
                                pcVar7 = nng_strerror(nVar4);
                                acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                 "nng_msg_header_trim_u64(msg, &v)",pcVar5,3,pcVar7,
                                                 (ulong)nVar4);
                                nVar2 = nng_msg_header_chop_u64((nng_msg *)v,&local_40);
                                pcVar5 = nng_strerror(NNG_EINVAL);
                                acutest_check_((uint)(nVar2 == NNG_EINVAL),
                                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                               ,0x1da,"%s fails with %s",
                                               "nng_msg_header_chop_u64(msg, &v)",pcVar5);
                                pcVar5 = nng_strerror(NNG_EINVAL);
                                pcVar7 = nng_strerror(nVar2);
                                acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                 "nng_msg_header_chop_u64(msg, &v)",pcVar5,3,pcVar7,
                                                 (ulong)nVar2);
                                nng_msg_clear((nng_msg *)v);
                                nVar2 = nng_msg_append((nng_msg *)v,&local_40,1);
                                pcVar5 = nng_strerror(nVar2);
                                iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                  ,0x1dd,"%s: expected success, got %s (%d)",
                                                  "nng_msg_append(msg, &v, 1)",pcVar5,nVar2);
                                if (iVar3 != 0) {
                                  nVar4 = nng_msg_trim_u64((nng_msg *)v,&local_40);
                                  pcVar5 = nng_strerror(NNG_EINVAL);
                                  acutest_check_((uint)(nVar4 == NNG_EINVAL),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                 ,0x1de,"%s fails with %s",
                                                 "nng_msg_trim_u64(msg, &v)",pcVar5,nVar2);
                                  pcVar5 = nng_strerror(NNG_EINVAL);
                                  pcVar7 = nng_strerror(nVar4);
                                  acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                   "nng_msg_trim_u64(msg, &v)",pcVar5,3,pcVar7,
                                                   (ulong)nVar4);
                                  nVar2 = nng_msg_chop_u64((nng_msg *)v,&local_40);
                                  pcVar5 = nng_strerror(NNG_EINVAL);
                                  acutest_check_((uint)(nVar2 == NNG_EINVAL),
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message_test.c"
                                                 ,0x1df,"%s fails with %s",
                                                 "nng_msg_chop_u64(msg, &v)",pcVar5);
                                  pcVar5 = nng_strerror(NNG_EINVAL);
                                  pcVar7 = nng_strerror(nVar2);
                                  acutest_message_("%s: expected %s (%d), got %s (%d)",
                                                   "nng_msg_chop_u64(msg, &v)",pcVar5,3,pcVar7,
                                                   (ulong)nVar2);
                                  nng_msg_free((nng_msg *)v);
                                  return;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

void
test_msg_header_uint64(void)
{
	nng_msg *msg;
	uint64_t v;
	uint8_t  data[] = { 0, 0, 0, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 2, 0,
		 0, 0, 0, 0, 0, 0, 3 };

	NUTS_PASS(nng_msg_alloc(&msg, 0));

	NUTS_PASS(nng_msg_header_append_u64(msg, 2));
	NUTS_PASS(nng_msg_header_insert_u64(msg, 1));
	NUTS_PASS(nng_msg_header_append_u64(msg, 3));
	NUTS_PASS(nng_msg_header_insert_u64(msg, 0));
	NUTS_PASS(nng_msg_header_trim_u64(msg, &v));
	NUTS_ASSERT(v == 0);
	NUTS_ASSERT(nng_msg_header_len(msg) == sizeof(data));
	NUTS_ASSERT(memcmp(nng_msg_header(msg), data, sizeof(data)) == 0);
	NUTS_PASS(nng_msg_header_trim_u64(msg, &v));
	NUTS_ASSERT(v == 1);
	NUTS_PASS(nng_msg_header_chop_u64(msg, &v));
	NUTS_ASSERT(v == 3);
	NUTS_PASS(nng_msg_header_trim_u64(msg, &v));
	NUTS_ASSERT(v == 2);
	NUTS_FAIL(nng_msg_header_trim_u64(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_header_chop_u64(msg, &v), NNG_EINVAL);

	nng_msg_clear(msg);
	NUTS_PASS(nng_msg_append(msg, &v, 1));
	NUTS_FAIL(nng_msg_trim_u64(msg, &v), NNG_EINVAL);
	NUTS_FAIL(nng_msg_chop_u64(msg, &v), NNG_EINVAL);

	nng_msg_free(msg);
}